

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

int getMessageContentAndSize
              (IOTHUB_MESSAGE_HANDLE message,uchar **messageContent,size_t *messageContentSize)

{
  IOTHUBMESSAGE_CONTENT_TYPE IVar1;
  IOTHUB_MESSAGE_RESULT IVar2;
  size_t sVar3;
  LOGGER_LOG p_Var4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t sStack_40;
  IOTHUBMESSAGE_CONTENT_TYPE contentType;
  size_t contentSize;
  char *contentStr;
  uchar *contentByteArr;
  size_t *psStack_20;
  int result;
  size_t *messageContentSize_local;
  uchar **messageContent_local;
  IOTHUB_MESSAGE_HANDLE message_local;
  
  psStack_20 = messageContentSize;
  messageContentSize_local = (size_t *)messageContent;
  messageContent_local = (uchar **)message;
  IVar1 = IoTHubMessage_GetContentType(message);
  if (IVar1 == IOTHUBMESSAGE_BYTEARRAY) {
    IVar2 = IoTHubMessage_GetByteArray
                      ((IOTHUB_MESSAGE_HANDLE)messageContent_local,(uchar **)&contentStr,
                       &stack0xffffffffffffffc0);
    if (IVar2 == IOTHUB_MESSAGE_OK) {
      *messageContentSize_local = (size_t)contentStr;
      *psStack_20 = sStack_40;
      contentByteArr._4_4_ = 0;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"getMessageContentAndSize",0x1aa,1,
                  "Failed getting the BYTE array representation of the IOTHUB_MESSAGE_HANDLE instance."
                 );
      }
      contentByteArr._4_4_ = 0x1ab;
    }
  }
  else if (IVar1 == IOTHUBMESSAGE_STRING) {
    contentSize = (size_t)IoTHubMessage_GetString((IOTHUB_MESSAGE_HANDLE)messageContent_local);
    if ((char *)contentSize == (char *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"getMessageContentAndSize",0x1b7,1,
                  "Failed getting the STRING representation of the IOTHUB_MESSAGE_HANDLE instance.")
        ;
      }
      contentByteArr._4_4_ = 0x1b8;
    }
    else {
      sVar3 = strlen((char *)contentSize);
      *messageContentSize_local = contentSize;
      *psStack_20 = sVar3;
      contentByteArr._4_4_ = 0;
    }
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"getMessageContentAndSize",0x1c3,1,
                "Cannot parse IOTHUB_MESSAGE_HANDLE with content type IOTHUBMESSAGE_UNKNOWN.");
    }
    contentByteArr._4_4_ = 0x1c4;
  }
  return contentByteArr._4_4_;
}

Assistant:

static int getMessageContentAndSize(IOTHUB_MESSAGE_HANDLE message, unsigned const char** messageContent, size_t* messageContentSize)
{
    int result;
    unsigned const char* contentByteArr;
    const char* contentStr;
    size_t contentSize;

    IOTHUBMESSAGE_CONTENT_TYPE contentType = IoTHubMessage_GetContentType(message);

    switch (contentType)
    {
    case IOTHUBMESSAGE_BYTEARRAY:
        if (IoTHubMessage_GetByteArray(message, &contentByteArr, &contentSize) != IOTHUB_MESSAGE_OK)
        {
            LogError("Failed getting the BYTE array representation of the IOTHUB_MESSAGE_HANDLE instance.");
            result = MU_FAILURE;
        }
        else
        {
            *messageContent = contentByteArr;
            *messageContentSize = contentSize;
            result = 0;
        }
        break;
    case IOTHUBMESSAGE_STRING:
        if ((contentStr = IoTHubMessage_GetString(message)) == NULL)
        {
            LogError("Failed getting the STRING representation of the IOTHUB_MESSAGE_HANDLE instance.");
            result = MU_FAILURE;
        }
        else
        {
            contentSize = strlen(contentStr);
            *messageContent = (unsigned const char*)contentStr;
            *messageContentSize = contentSize;
            result = 0;
        }
        break;
    default:
        LogError("Cannot parse IOTHUB_MESSAGE_HANDLE with content type IOTHUBMESSAGE_UNKNOWN.");
        result = MU_FAILURE;
        break;
    }
    return result;
}